

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ipc.c
# Opt level: O2

int ipc_helper_closed_handle(void)

{
  int iVar1;
  uint uVar2;
  undefined8 uVar3;
  uv_loop_t *loop;
  char *pcVar4;
  
  memset(buffer,0x2e,100000);
  large_buf = (uv_buf_t)uv_buf_init(buffer,100000);
  uVar3 = uv_default_loop();
  iVar1 = uv_pipe_init(uVar3,&channel,1);
  if (iVar1 == 0) {
    uv_pipe_open(&channel,0);
    iVar1 = uv_is_readable(&channel);
    if (iVar1 == 1) {
      iVar1 = uv_is_writable(&channel);
      if (iVar1 == 1) {
        iVar1 = uv_is_closing(&channel);
        if (iVar1 == 0) {
          uVar2 = write_until_data_queued();
          if (uVar2 != 0) {
            send_handle_and_close();
          }
          uVar3 = uv_default_loop();
          iVar1 = uv_run(uVar3,0);
          if (iVar1 == 0) {
            if (closed_handle_write == '\0') {
              pcVar4 = "closed_handle_write == 1";
              uVar3 = 0x37b;
            }
            else {
              loop = (uv_loop_t *)uv_default_loop();
              close_loop(loop);
              uVar3 = uv_default_loop();
              iVar1 = uv_loop_close(uVar3);
              if (iVar1 == 0) {
                return 0;
              }
              pcVar4 = "0 == uv_loop_close(uv_default_loop())";
              uVar3 = 0x37d;
            }
          }
          else {
            pcVar4 = "r == 0";
            uVar3 = 0x379;
          }
        }
        else {
          pcVar4 = "0 == uv_is_closing((uv_handle_t*) &channel)";
          uVar3 = 0x373;
        }
      }
      else {
        pcVar4 = "1 == uv_is_writable((uv_stream_t*) &channel)";
        uVar3 = 0x372;
      }
    }
    else {
      pcVar4 = "1 == uv_is_readable((uv_stream_t*) &channel)";
      uVar3 = 0x371;
    }
  }
  else {
    pcVar4 = "r == 0";
    uVar3 = 0x36d;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ipc.c"
          ,uVar3,pcVar4);
  abort();
}

Assistant:

int ipc_helper_closed_handle(void) {
  int r;

  memset(buffer, '.', LARGE_SIZE);
  large_buf = uv_buf_init(buffer, LARGE_SIZE);

  r = uv_pipe_init(uv_default_loop(), &channel, 1);
  ASSERT(r == 0);

  uv_pipe_open(&channel, 0);

  ASSERT(1 == uv_is_readable((uv_stream_t*) &channel));
  ASSERT(1 == uv_is_writable((uv_stream_t*) &channel));
  ASSERT(0 == uv_is_closing((uv_handle_t*) &channel));

  if (write_until_data_queued() > 0)
    send_handle_and_close();

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT(r == 0);

  ASSERT(closed_handle_write == 1);

  MAKE_VALGRIND_HAPPY();
  return 0;
}